

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.cpp
# Opt level: O3

void __thiscall
VBitmap::VBitmap(VBitmap *this,uint8_t *data,size_t width,size_t height,size_t bytesPerLine,
                Format format)

{
  model *pmVar1;
  undefined7 in_register_00000089;
  vshared_ptr<VBitmap::Impl,_unsigned_long> local_38;
  
  (this->mImpl).mModel = (model *)0x0;
  if ((int)CONCAT71(in_register_00000089,format) != 0 &&
      ((bytesPerLine != 0 && height != 0) && (width != 0 && data != (uint8_t *)0x0))) {
    pmVar1 = (model *)operator_new(0x28);
    pmVar1->mRef = 1;
    (pmVar1->mValue).mOwnData._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false> = (_Head_base<0UL,_unsigned_char_*,_false>)0x0;
    (pmVar1->mValue).mRoData = (uint8_t *)0x0;
    *(undefined8 *)((long)&(pmVar1->mValue).mRoData + 6) = 0;
    *(undefined8 *)((long)&(pmVar1->mValue).mHeight + 2) = 0;
    Impl::reset(&pmVar1->mValue,data,width,height,bytesPerLine,format);
    vshared_ptr<VBitmap::Impl,_unsigned_long>::unref(&this->mImpl);
    (this->mImpl).mModel = pmVar1;
    local_38.mModel = (model *)0x0;
    vshared_ptr<VBitmap::Impl,_unsigned_long>::unref(&local_38);
  }
  return;
}

Assistant:

VBitmap::VBitmap(uint8_t *data, size_t width, size_t height,
                 size_t bytesPerLine, VBitmap::Format format)
{
    if (!data || width <= 0 || height <= 0 || bytesPerLine <= 0 ||
        format == Format::Invalid)
        return;

    mImpl = rc_ptr<Impl>(data, width, height, bytesPerLine, format);
}